

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float coeff_mean;
  int dims_1;
  int scale;
  int axis;
  int i;
  int reduced_axes_num;
  int *axes_ptr;
  bool reduce_c;
  bool reduce_d;
  bool reduce_h;
  bool reduce_w;
  int axes_flag [4];
  int dims;
  float in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool reduce_c_00;
  bool reduce_d_00;
  bool reduce_h_00;
  bool reduce_w_00;
  float v0;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar7;
  int in_stack_ffffffffffffff9c;
  int local_60;
  int in_stack_ffffffffffffffb8;
  int local_44;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_c;
  
  iVar1 = *(int *)(in_RSI + 0x28);
  memset(&stack0xffffffffffffffb8,0,0x10);
  bVar4 = false;
  bVar3 = false;
  bVar6 = false;
  bVar5 = false;
  if (*(int *)(in_RDI + 0xd4) == 0) {
    lVar2 = *(long *)(in_RDI + 0xe0);
    iVar7 = *(int *)(in_RDI + 0x10c);
    for (local_60 = 0; local_60 < iVar7; local_60 = local_60 + 1) {
      in_stack_ffffffffffffff9c = *(int *)(lVar2 + (long)local_60 * 4);
      if (in_stack_ffffffffffffff9c < 0) {
        in_stack_ffffffffffffff9c = iVar1 + in_stack_ffffffffffffff9c;
      }
      *(undefined4 *)(&stack0xffffffffffffffb8 + (long)in_stack_ffffffffffffff9c * 4) = 1;
    }
    if (iVar1 == 1) {
      bVar4 = true;
    }
    else if (iVar1 == 2) {
      bVar3 = in_stack_ffffffffffffffb8 == 1;
      bVar4 = local_44 == 1;
    }
    else if (iVar1 == 3) {
      bVar5 = in_stack_ffffffffffffffb8 == 1;
      bVar3 = local_44 == 1;
      bVar4 = in_stack_ffffffffffffffc0 == 1;
    }
    else if (iVar1 == 4) {
      bVar5 = in_stack_ffffffffffffffb8 == 1;
      bVar6 = local_44 == 1;
      bVar3 = in_stack_ffffffffffffffc0 == 1;
      bVar4 = in_stack_ffffffffffffffc4 == 1;
    }
  }
  else {
    bVar4 = true;
    bVar3 = true;
    bVar6 = true;
    bVar5 = true;
  }
  reduce_c_00 = SUB81(in_RDI,0);
  reduce_d_00 = SUB81((ulong)in_RDI >> 8,0);
  reduce_h_00 = SUB81((ulong)in_RDI >> 0x10,0);
  reduce_w_00 = SUB81((ulong)in_RDI >> 0x18,0);
  v0 = (float)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_c = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 1) {
    local_c = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 2) {
    local_c = reduction<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 3) {
    iVar7 = 1;
    iVar1 = *(int *)(in_RSI + 0x28);
    if (iVar1 == 1) {
      iVar7 = *(int *)(in_RSI + 0x2c);
    }
    else if (iVar1 == 2) {
      if (bVar4) {
        iVar7 = *(int *)(in_RSI + 0x2c);
      }
      if (bVar3) {
        iVar7 = *(int *)(in_RSI + 0x30) * iVar7;
      }
    }
    else if (iVar1 == 3) {
      if (bVar4) {
        iVar7 = *(int *)(in_RSI + 0x2c);
      }
      if (bVar3) {
        iVar7 = *(int *)(in_RSI + 0x30) * iVar7;
      }
      if (bVar5) {
        iVar7 = *(int *)(in_RSI + 0x38) * iVar7;
      }
    }
    else if (iVar1 == 4) {
      if (bVar4) {
        iVar7 = *(int *)(in_RSI + 0x2c);
      }
      if (bVar3) {
        iVar7 = *(int *)(in_RSI + 0x30) * iVar7;
      }
      if (bVar6) {
        iVar7 = *(int *)(in_RSI + 0x34) * iVar7;
      }
      if (bVar5) {
        iVar7 = *(int *)(in_RSI + 0x38) * iVar7;
      }
    }
    local_c = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,iVar7),
                         (Mat *)CONCAT44(iVar1,*(float *)(in_RDI + 0xd8) / (float)iVar7),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 4) {
    local_c = reduction<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 5) {
    local_c = reduction<ncnn::reduction_op_min<float>,ncnn::reduction_op_min<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 6) {
    local_c = reduction<ncnn::reduction_op_mul<float>,ncnn::reduction_op_mul<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 7) {
    local_c = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 8) {
    local_c = reduction<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>,ncnn::post_process_sqrt<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 9) {
    local_c = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_log<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (*(int *)(in_RDI + 0xd0) == 10) {
    local_c = reduction<ncnn::reduction_op_sumsexp<float>,ncnn::reduction_op_add<float>,ncnn::post_process_log<float>>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v0,
                         reduce_w_00,reduce_h_00,reduce_d_00,reduce_c_00,
                         (bool)in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffffb8,
                         (Option *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }
        else if (dims == 4)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_d) scale *= bottom_blob.d;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}